

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O0

boolean grddead(monst *grd)

{
  boolean local_11;
  boolean dispose;
  monst *grd_local;
  
  local_11 = clear_fcorr(grd,'\x01');
  if (local_11 == '\0') {
    remove_monster(level,(int)grd->mx,(int)grd->my);
    newsym((int)grd->mx,(int)grd->my);
    place_monster(grd,0,0);
    *(xchar *)((long)&grd[1].data + 2) = grd->mx;
    *(xchar *)((long)&grd[1].data + 3) = grd->my;
    local_11 = clear_fcorr(grd,'\x01');
  }
  return local_11;
}

Assistant:

boolean grddead(struct monst *grd)
{
	boolean dispose = clear_fcorr(grd, TRUE);

	if (!dispose) {
		/* see comment by newpos in gd_move() */
		remove_monster(level, grd->mx, grd->my);
		newsym(grd->mx, grd->my);
		place_monster(grd, 0, 0);
		EGD(grd)->ogx = grd->mx;
		EGD(grd)->ogy = grd->my;
		dispose = clear_fcorr(grd, TRUE);
	}
	return dispose;
}